

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetwindow.cpp
# Opt level: O1

void __thiscall QWidgetWindow::handleGestureEvent(QWidgetWindow *this,QNativeGestureEvent *e)

{
  Data *pDVar1;
  undefined4 uVar2;
  uint uVar3;
  QWidget *this_00;
  QWidget *pQVar4;
  ulong uVar5;
  ulong uVar6;
  long in_FS_OFFSET;
  double extraout_XMM0_Qa;
  undefined1 auVar7 [16];
  double extraout_XMM1_Qa;
  undefined1 auVar8 [16];
  QPoint local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = QApplication::activePopupWidget();
  if (this_00 == (QWidget *)0x0) {
    pQVar4 = (QWidget *)0x0;
  }
  else {
    pQVar4 = QWidget::focusWidget(this_00);
    if (pQVar4 == (QWidget *)0x0) {
      pQVar4 = this_00;
    }
  }
  if (pQVar4 == (QWidget *)0x0) {
    uVar2 = QEventPoint::globalPosition();
    auVar8._0_8_ = (double)((ulong)extraout_XMM1_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
                   extraout_XMM1_Qa;
    auVar8._8_8_ = (double)((ulong)extraout_XMM0_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
                   extraout_XMM0_Qa;
    auVar8 = minpd(_DAT_0066f5d0,auVar8);
    auVar7._8_8_ = -(ulong)(-2147483648.0 < auVar8._8_8_);
    auVar7._0_8_ = -(ulong)(-2147483648.0 < auVar8._0_8_);
    uVar3 = movmskpd(uVar2,auVar7);
    uVar6 = 0x8000000000000000;
    if ((uVar3 & 1) != 0) {
      uVar6 = (ulong)(uint)(int)auVar8._0_8_ << 0x20;
    }
    uVar5 = 0x80000000;
    if ((uVar3 & 2) != 0) {
      uVar5 = (ulong)(uint)(int)auVar8._8_8_;
    }
    local_28 = (QPoint)(uVar5 | uVar6);
    pQVar4 = QApplication::widgetAt(&local_28);
  }
  if (pQVar4 == (QWidget *)0x0) {
    pDVar1 = (this->m_widget).wp.d;
    if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
      pQVar4 = (QWidget *)0x0;
    }
    else {
      pQVar4 = (QWidget *)(this->m_widget).wp.value;
    }
  }
  QCoreApplication::forwardEvent(&pQVar4->super_QObject,(QEvent *)e,(QEvent *)0x0);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetWindow::handleGestureEvent(QNativeGestureEvent *e)
{
    // copy-pasted code to find correct widget follows:
    QObject *receiver = nullptr;
    if (auto *popup = QApplication::activePopupWidget()) {
        QWidget *popupFocusWidget = popup->focusWidget();
        receiver = popupFocusWidget ? popupFocusWidget : popup;
    }
    if (!receiver)
        receiver = QApplication::widgetAt(e->globalPosition().toPoint());
    if (!receiver)
        receiver = m_widget; // last resort

    QApplication::forwardEvent(receiver, e);
}